

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

int helics::getPropertyIndex(string *val)

{
  int iVar1;
  const_iterator pvVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  undefined1 local_61;
  string local_60;
  string local_40;
  
  pvVar2 = frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::find<std::__cxx11::string>
                     ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)propStringsTranslations,val);
  if (pvVar2 == (const_iterator)(propStringsTranslations + 0x680)) {
    gmlc::utilities::makeLowerCase((string *)val);
    pvVar2 = frozen::
             unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
             ::find<std::__cxx11::string>
                       ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)propStringsTranslations,val);
    if (pvVar2 == (const_iterator)(propStringsTranslations + 0x680)) {
      std::__cxx11::string::string((string *)&local_40,val);
      iVar1 = getFlagIndex(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (-1 < iVar1) {
        return iVar1;
      }
      _Var3._M_current = (val->_M_dataplus)._M_p;
      local_61 = 0x5f;
      _Var3 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (_Var3,_Var3._M_current + val->_M_string_length,
                         (_Iter_equals_val<const_char>)&local_61);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (val,(__const_iterator)_Var3._M_current,
                 (__const_iterator)((val->_M_dataplus)._M_p + val->_M_string_length));
      pvVar2 = frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::__cxx11::string>
                         ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)propStringsTranslations,val);
      if (pvVar2 == (const_iterator)(propStringsTranslations + 0x680)) {
        std::__cxx11::string::string((string *)&local_60,val);
        iVar1 = getFlagIndex(&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        return iVar1;
      }
    }
  }
  return pvVar2->second;
}

Assistant:

int getPropertyIndex(std::string val)
{
    const auto* fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    gmlc::utilities::makeLowerCase(val);
    fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    auto res = getFlagIndex(val);
    if (res >= 0) {
        return res;
    }
    val.erase(std::remove(val.begin(), val.end(), '_'), val.end());
    fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    return getFlagIndex(val);
}